

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O3

idx_t __thiscall
duckdb::LogicalOperator::EstimateCardinality(LogicalOperator *this,ClientContext *context)

{
  pointer puVar1;
  int iVar2;
  pointer pLVar3;
  undefined4 extraout_var;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this_00;
  ulong uVar4;
  
  if (this->has_estimated_cardinality == true) {
    uVar4 = this->estimated_cardinality;
  }
  else {
    this_00 = (this->children).
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 == puVar1) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(this_00);
        iVar2 = (*pLVar3->_vptr_LogicalOperator[7])(pLVar3,context);
        if (uVar4 < CONCAT44(extraout_var,iVar2)) {
          uVar4 = CONCAT44(extraout_var,iVar2);
        }
        this_00 = this_00 + 1;
      } while (this_00 != puVar1);
    }
    this->has_estimated_cardinality = true;
    this->estimated_cardinality = uVar4;
  }
  return uVar4;
}

Assistant:

idx_t LogicalOperator::EstimateCardinality(ClientContext &context) {
	// simple estimator, just take the max of the children
	if (has_estimated_cardinality) {
		return estimated_cardinality;
	}
	idx_t max_cardinality = 0;
	for (auto &child : children) {
		max_cardinality = MaxValue(child->EstimateCardinality(context), max_cardinality);
	}
	has_estimated_cardinality = true;
	estimated_cardinality = max_cardinality;
	return estimated_cardinality;
}